

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unrolling.cpp
# Opt level: O3

void __thiscall
optimization::loop_unrolling::Loop_Unrolling::optimize_func(Loop_Unrolling *this,MirFunction *func)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  int iVar3;
  _Base_ptr p_Var4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  uint extraout_var;
  pointer puVar7;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> vars;
  optional<optimization::loop_unrolling::loop_info> info;
  set<int,_std::less<int>,_std::allocator<int>_> base_blks;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_188;
  loop_info local_158;
  _Storage<optimization::loop_unrolling::loop_info,_true> local_f8;
  char local_98;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_90,(int *)(p_Var4 + 1));
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  do {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&local_60,&local_90);
    find_loop_start((optional<optimization::loop_unrolling::loop_info> *)&local_f8._M_value,func,
                    (set<int,_std::less<int>,_std::allocator<int>_> *)&local_60);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_60);
    if (local_98 == '\0') {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_90);
      return;
    }
    mir::inst::MirFunction::variable_table_size(func);
    local_188._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_188._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_188._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_188._M_impl.super__Rb_tree_header._M_header;
    local_188._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_188._M_impl.super__Rb_tree_header._M_header._M_right =
         local_188._M_impl.super__Rb_tree_header._M_header._M_left;
    pmVar5 = std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::at(&func->basic_blks,&local_f8._M_value.loop_start);
    pmVar5 = std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::at(&func->basic_blks,&(pmVar5->jump).bb_true);
    puVar2 = (pmVar5->inst).
             super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar7 = (pmVar5->inst).
                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1)
    {
      iVar3 = (*(((puVar7->_M_t).
                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t
                  .super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
                _vptr_Displayable[1])();
      if (iVar3 != 7) {
        pmVar6 = std::
                 map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                 ::at(&func->variables,
                      &(((puVar7->_M_t).
                         super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                         .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest).id);
        (*(((pmVar6->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_Displayable)._vptr_Displayable[3])();
        if ((extraout_var & 1) == 0) {
          std::__throw_bad_optional_access();
        }
      }
    }
    if (local_98 == '\0') {
      std::__throw_bad_optional_access();
    }
    local_158.unrolling_times = local_f8._M_value.unrolling_times;
    local_158.loop_start = local_f8._M_value.loop_start;
    local_158.func = local_f8._M_value.func;
    local_158.init_var.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
    local_158.init_var.id = local_f8._M_value.init_var.id;
    local_158.cmp.first = local_f8._M_value.cmp.first;
    local_158.cmp.second.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
    local_158.cmp.second.id = local_f8._M_value.cmp.second.id;
    local_158.change = local_f8._M_value.change;
    local_158.phi_var.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
    local_158.phi_var.id = local_f8._M_value.phi_var.id;
    local_158.change_var.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
    local_158.change_var.id = local_f8._M_value.change_var.id;
    expand_loop(func,pmVar5,&local_158);
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree(&local_188);
  } while( true );
}

Assistant:

void Loop_Unrolling::optimize_func(mir::inst::MirFunction& func) {
  std::set<mir::types::LabelId> base_blks;
  for (auto& blkpair : func.basic_blks) {
    base_blks.insert(blkpair.first);
  }
  auto& startblk = func.basic_blks.begin()->second;
  while (true) {
    auto info = find_loop_start(func, base_blks);
    if (!info.has_value()) {
      break;
    }
    int size = func.variable_table_size();
    std::set<mir::inst::VarId> vars;
    auto& blk =
        func.basic_blks.at(func.basic_blks.at(info->loop_start).jump.bb_true);

    int times = info->get_times();
    for (auto& inst : blk.inst) {
      if (inst->inst_kind() == mir::inst::InstKind::Phi) {
        continue;
      }
      size += times * func.variables.at(inst->dest.id).size();
    }

    // if (size >= 1024) {
    //   return;
    // }
    expand_loop(func, blk, info.value());
  }
}